

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall CLIntercept::logDeviceInfo(CLIntercept *this,cl_device_id device)

{
  uint uVar1;
  cl_icd_dispatch *pcVar2;
  cl_device_id in_RSI;
  CLIntercept *in_RDI;
  float __x;
  float fVar3;
  undefined8 extraout_XMM0_Qa;
  undefined8 uVar4;
  undefined8 extraout_XMM0_Qa_00;
  double __x_00;
  char *nextExtension;
  char *extension;
  int numberOfExtensions;
  char *deviceExtensions;
  char *driverVersion;
  char *deviceVersion;
  char *deviceVendor;
  char *deviceName;
  cl_device_type deviceType;
  cl_int errorCode;
  char **in_stack_ffffffffffffff38;
  cl_device_info in_stack_ffffffffffffff44;
  CLIntercept *in_stack_ffffffffffffff50;
  string local_a8 [24];
  cl_device_type in_stack_ffffffffffffff70;
  CEnumNameMap *in_stack_ffffffffffffff78;
  char *local_80;
  string local_68 [32];
  char *local_48;
  void *local_40;
  void *local_38;
  void *local_30;
  void *local_28;
  undefined1 local_20 [12];
  uint local_14;
  cl_device_id local_10;
  
  local_14 = 0;
  local_28 = (void *)0x0;
  local_30 = (void *)0x0;
  local_38 = (void *)0x0;
  local_40 = (void *)0x0;
  local_48 = (char *)0x0;
  local_10 = in_RSI;
  pcVar2 = dispatch(in_RDI);
  uVar1 = (*pcVar2->clGetDeviceInfo)(local_10,0x1000,8,local_20,(size_t *)0x0);
  local_14 = uVar1 | local_14;
  uVar1 = allocateAndGetDeviceInfoString
                    (in_stack_ffffffffffffff50,(cl_device_id)in_RDI,in_stack_ffffffffffffff44,
                     in_stack_ffffffffffffff38);
  local_14 = uVar1 | local_14;
  uVar1 = allocateAndGetDeviceInfoString
                    (in_stack_ffffffffffffff50,(cl_device_id)in_RDI,in_stack_ffffffffffffff44,
                     in_stack_ffffffffffffff38);
  local_14 = uVar1 | local_14;
  uVar1 = allocateAndGetDeviceInfoString
                    (in_stack_ffffffffffffff50,(cl_device_id)in_RDI,in_stack_ffffffffffffff44,
                     in_stack_ffffffffffffff38);
  local_14 = uVar1 | local_14;
  uVar1 = allocateAndGetDeviceInfoString
                    (in_stack_ffffffffffffff50,(cl_device_id)in_RDI,in_stack_ffffffffffffff44,
                     in_stack_ffffffffffffff38);
  local_14 = uVar1 | local_14;
  uVar1 = allocateAndGetDeviceInfoString
                    (in_stack_ffffffffffffff50,(cl_device_id)in_RDI,in_stack_ffffffffffffff44,
                     in_stack_ffffffffffffff38);
  local_14 = uVar1 | local_14;
  if (local_14 == 0) {
    fVar3 = logf(in_RDI,__x);
    fVar3 = logf(in_RDI,fVar3);
    fVar3 = logf(in_RDI,fVar3);
    logf(in_RDI,fVar3);
    enumName(in_RDI);
    CEnumNameMap::name_device_type_abi_cxx11_(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    fVar3 = (float)std::__cxx11::string::c_str();
    logf(in_RDI,fVar3);
    fVar3 = (float)std::__cxx11::string::~string(local_68);
    fVar3 = logf(in_RDI,fVar3);
    if (local_48 != (char *)0x0) {
      local_80 = strtok_r(local_48," ",(char **)&stack0xffffffffffffff78);
      uVar4 = extraout_XMM0_Qa;
      while (fVar3 = (float)uVar4, local_80 != (char *)0x0) {
        logf(in_RDI,fVar3);
        local_80 = strtok_r((char *)0x0," ",(char **)&stack0xffffffffffffff78);
        uVar4 = extraout_XMM0_Qa_00;
      }
    }
    logf(in_RDI,fVar3);
  }
  else {
    std::allocator<char>::allocator();
    __x_00 = (double)std::__cxx11::string::string
                               (local_a8,"Error getting device info!\n",
                                (allocator *)&stack0xffffffffffffff57);
    log(in_RDI,__x_00);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff57);
  }
  if (local_28 != (void *)0x0) {
    operator_delete__(local_28);
  }
  if (local_30 != (void *)0x0) {
    operator_delete__(local_30);
  }
  if (local_38 != (void *)0x0) {
    operator_delete__(local_38);
  }
  if (local_40 != (void *)0x0) {
    operator_delete__(local_40);
  }
  if (local_48 != (char *)0x0) {
    operator_delete__(local_48);
  }
  return;
}

Assistant:

void CLIntercept::logDeviceInfo( cl_device_id device )
{
    cl_int  errorCode = CL_SUCCESS;

    cl_device_type  deviceType;
    char*   deviceName = NULL;
    char*   deviceVendor = NULL;
    char*   deviceVersion = NULL;
    char*   driverVersion = NULL;
    char*   deviceExtensions = NULL;

    errorCode |= dispatch().clGetDeviceInfo(
        device,
        CL_DEVICE_TYPE,
        sizeof( deviceType ),
        &deviceType,
        NULL );
    errorCode |= allocateAndGetDeviceInfoString(
        device,
        CL_DEVICE_NAME,
        deviceName );
    errorCode |= allocateAndGetDeviceInfoString(
        device,
        CL_DEVICE_VENDOR,
        deviceVendor );
    errorCode |= allocateAndGetDeviceInfoString(
        device,
        CL_DEVICE_VERSION,
        deviceVersion );
    errorCode |= allocateAndGetDeviceInfoString(
        device,
        CL_DRIVER_VERSION,
        driverVersion );
    errorCode |= allocateAndGetDeviceInfoString(
        device,
        CL_DEVICE_EXTENSIONS,
        deviceExtensions );

    if( errorCode == CL_SUCCESS )
    {
        logf( "\tName:           %s\n", deviceName );
        logf( "\tVendor:         %s\n", deviceVendor );
        logf( "\tVersion:        %s\n", deviceVersion );
        logf( "\tDriver Version: %s\n", driverVersion );
        logf( "\tType:           %s\n", enumName().name_device_type( deviceType ).c_str() );

        int     numberOfExtensions = 0;
        logf( "\tExtensions:\n" );
        if( deviceExtensions )
        {
            char*   extension = NULL;
            char*   nextExtension = NULL;
            extension = CLI_STRTOK( deviceExtensions, " ", &nextExtension );
            while( extension != NULL )
            {
                numberOfExtensions++;
                logf( "\t\t%s\n", extension );
                extension = CLI_STRTOK( NULL, " ", &nextExtension );
            }
        }
        logf( "\t\t%d Device Extensions Found\n", numberOfExtensions );
    }
    else
    {
        log( "Error getting device info!\n" );
    }

    delete [] deviceName;
    delete [] deviceVendor;
    delete [] deviceVersion;
    delete [] driverVersion;
    delete [] deviceExtensions;
}